

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

char * __thiscall Am_Value::To_String(Am_Value *this)

{
  Am_ID_Tag AVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Am_Type_Support *pAVar3;
  undefined4 extraout_var_01;
  ostream *this_00;
  ostrstream local_190 [8];
  ostrstream oss;
  Am_Type_Support *support;
  char *ret_str;
  Am_Value *this_local;
  
  support = (Am_Type_Support *)0x0;
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0x2000) {
    if ((this->value).wrapper_value != (Am_Wrapper *)0x0) {
      iVar2 = (*(((this->value).wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type
                [1])();
      support = (Am_Type_Support *)CONCAT44(extraout_var,iVar2);
    }
  }
  else if (AVar1 == 0x3000) {
    if ((this->value).wrapper_value != (Am_Wrapper *)0x0) {
      iVar2 = (*(((this->value).wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type
                [1])();
      support = (Am_Type_Support *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  else if ((AVar1 == 0x4000) &&
          (pAVar3 = Am_Find_Support(this->type), pAVar3 != (Am_Type_Support *)0x0)) {
    iVar2 = (*pAVar3->_vptr_Am_Type_Support[1])(pAVar3,this);
    support = (Am_Type_Support *)CONCAT44(extraout_var_01,iVar2);
  }
  if (support == (Am_Type_Support *)0x0) {
    std::ostrstream::ostrstream(local_190,To_String::line,0xfa,_S_out);
    this_00 = ::operator<<((ostream *)local_190,this);
    std::ostream::operator<<(this_00,std::ends<char,std::char_traits<char>>);
    this_local = (Am_Value *)To_String::line;
    std::ostrstream::~ostrstream(local_190);
  }
  else {
    this_local = (Am_Value *)support;
  }
  return (char *)this_local;
}

Assistant:

const char *
Am_Value::To_String() const
{
  const char *ret_str = nullptr;
  switch (Am_Type_Class(type)) {
  case Am_WRAPPER:
    if (value.wrapper_value) // complains about const with call to valid
      ret_str = value.wrapper_value->To_String();
    break;
  case Am_METHOD:
    if (value.method_value)
      ret_str = value.method_value->To_String();
    break;
  case Am_ENUM: {
    Am_Type_Support *support = Am_Find_Support(type);
    if (support)
      ret_str = support->To_String(*this);
    break;
  }
  }
  if (ret_str)
    return ret_str;
  else { //use expensive technique
    static char line[250];
    OSTRSTREAM_CONSTR(oss, line, 250, std::ios::out);
    oss << *this << std::ends;
    OSTRSTREAM_COPY(oss, line, 250);
    return line;
  }
}